

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

bool __thiscall
CLIntercept::overrideGetPlatformInfo
          (CLIntercept *this,cl_platform_id platform,cl_platform_info param_name,
          size_t param_value_size,void *param_value,size_t *param_value_size_ret,cl_int *errorCode)

{
  cl_int cVar1;
  ulong uVar2;
  size_t in_RCX;
  int in_EDX;
  CLIntercept *in_RDI;
  uint *in_R8;
  size_t *in_R9;
  cl_int *in_stack_00000008;
  cl_semaphore_type_khr type;
  cl_semaphore_type_khr *ptr_6;
  cl_name_version_khr *ptr_5;
  char *platformExtensions;
  cl_version_khr version;
  cl_version_khr *ptr_4;
  size_t minor;
  size_t major;
  char *platformVersion;
  char *ptr_3;
  char *ptr_2;
  char *ptr_1;
  char *ptr;
  bool override;
  undefined4 in_stack_ffffffffffffff64;
  size_t *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  char **in_stack_ffffffffffffff78;
  size_t *psVar3;
  undefined4 in_stack_ffffffffffffff80;
  cl_platform_info in_stack_ffffffffffffff84;
  cl_name_version_khr *in_stack_ffffffffffffff88;
  CLIntercept *in_stack_ffffffffffffff90;
  bool local_31;
  
  local_31 = false;
  if (in_EDX == 0x900) {
    uVar2 = std::__cxx11::string::empty();
    local_31 = (uVar2 & 1) == 0;
    if (local_31) {
      cVar1 = writeStringToMemory((CLIntercept *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff68,
                                  (char *)CONCAT44(in_stack_ffffffffffffff64,in_EDX));
      *in_stack_00000008 = cVar1;
    }
  }
  else if (in_EDX == 0x901) {
    uVar2 = std::__cxx11::string::empty();
    local_31 = (uVar2 & 1) == 0;
    if (local_31) {
      cVar1 = writeStringToMemory((CLIntercept *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff68,
                                  (char *)CONCAT44(in_stack_ffffffffffffff64,in_EDX));
      *in_stack_00000008 = cVar1;
    }
  }
  else if (in_EDX == 0x902) {
    uVar2 = std::__cxx11::string::empty();
    local_31 = (uVar2 & 1) == 0;
    if (local_31) {
      cVar1 = writeStringToMemory((CLIntercept *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff68,
                                  (char *)CONCAT44(in_stack_ffffffffffffff64,in_EDX));
      *in_stack_00000008 = cVar1;
    }
  }
  else if (in_EDX == 0x903) {
    uVar2 = std::__cxx11::string::empty();
    local_31 = (uVar2 & 1) == 0;
    if (local_31) {
      cVar1 = writeStringToMemory((CLIntercept *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (size_t)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                                  in_stack_ffffffffffffff68,
                                  (char *)CONCAT44(in_stack_ffffffffffffff64,in_EDX));
      *in_stack_00000008 = cVar1;
    }
  }
  else if (in_EDX == 0x906) {
    if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
      cVar1 = allocateAndGetPlatformInfoString
                        (in_stack_ffffffffffffff90,(cl_platform_id)in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff84,in_stack_ffffffffffffff78);
      *in_stack_00000008 = cVar1;
    }
  }
  else if (in_EDX == 0x907) {
    if (((in_RDI->m_Config).Emulate_cl_khr_extended_versioning & 1U) != 0) {
      psVar3 = (size_t *)0x0;
      allocateAndGetPlatformInfoString
                (in_stack_ffffffffffffff90,(cl_platform_id)in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84,(char **)0x0);
      cVar1 = parseExtensionString
                        ((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),psVar3);
      *in_stack_00000008 = cVar1;
      local_31 = true;
      if (psVar3 != (size_t *)0x0) {
        operator_delete__(psVar3);
      }
    }
  }
  else if ((in_EDX == 0x2036) &&
          (local_31 = ((in_RDI->m_Config).Emulate_cl_khr_semaphore & 1U) != 0, local_31)) {
    cVar1 = writeParamToMemory<unsigned_int>(in_RDI,in_RCX,1,in_R9,in_R8);
    *in_stack_00000008 = cVar1;
  }
  return local_31;
}

Assistant:

bool CLIntercept::overrideGetPlatformInfo(
    cl_platform_id platform,
    cl_platform_info param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret,
    cl_int& errorCode ) const
{
    bool    override = false;

    switch( param_name )
    {
    case CL_PLATFORM_NAME:
        if( !m_Config.PlatformName.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformName,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VENDOR:
        if( !m_Config.PlatformVendor.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVendor,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_PROFILE:
        if( !m_Config.PlatformProfile.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformProfile,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_VERSION:
        if( !m_Config.PlatformVersion.empty() )
        {
            char*   ptr = (char*)param_value;
            errorCode = writeStringToMemory(
                param_value_size,
                m_Config.PlatformVersion,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    case CL_PLATFORM_NUMERIC_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformVersion = NULL;

            errorCode = allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_VERSION,
                platformVersion );
            if( errorCode == CL_SUCCESS && platformVersion )
            {
                // According to the spec, the device version string should have the form:
                //   OpenCL <Major>.<Minor> <Vendor Specific Info>
                size_t  major = 0;
                size_t  minor = 0;
                if( getMajorMinorVersionFromString(
                        "OpenCL ",
                        platformVersion,
                        major,
                        minor ) )
                {
                    cl_version_khr* ptr = (cl_version_khr*)param_value;
                    cl_version_khr  version = CL_MAKE_VERSION_KHR( major, minor, 0 );
                    errorCode = writeParamToMemory(
                        param_value_size,
                        version,
                        param_value_size_ret,
                        ptr );
                    override = true;
                }
            }

            delete [] platformVersion;
            platformVersion = NULL;
        }
        break;
    case CL_PLATFORM_EXTENSIONS_WITH_VERSION_KHR:
        if( m_Config.Emulate_cl_khr_extended_versioning )
        {
            char*   platformExtensions = NULL;

            allocateAndGetPlatformInfoString(
                platform,
                CL_PLATFORM_EXTENSIONS,
                platformExtensions );

            // Parse the extension string even if the query returned an error.
            // In this case we will simply return that zero extensions are supported.
            cl_name_version_khr*    ptr = (cl_name_version_khr*)param_value;
            errorCode = parseExtensionString(
                platformExtensions,
                ptr,
                param_value_size,
                param_value_size_ret );
            override = true;

            delete [] platformExtensions;
            platformExtensions = NULL;
        }
        break;
    case CL_PLATFORM_SEMAPHORE_TYPES_KHR:
        if( m_Config.Emulate_cl_khr_semaphore )
        {
            // If we decide to emulate multiple semaphore types we will need
            // to return an array, but for now we can return just the binary
            // semaphore type.
            auto    ptr = (cl_semaphore_type_khr*)param_value;
            cl_semaphore_type_khr type = CL_SEMAPHORE_TYPE_BINARY_KHR;
            errorCode = writeParamToMemory(
                param_value_size,
                type,
                param_value_size_ret,
                ptr );
            override = true;
        }
        break;
    default:
        break;
    }

    return override;
}